

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_42(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  char *pcVar8;
  long lVar9;
  QPDFObjGen QVar10;
  undefined8 uVar11;
  long *plVar12;
  size_type *psVar13;
  double dVar14;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle QVar16;
  Pl_Buffer pl1;
  Matrix m1;
  Rectangle r0;
  QPDFObjectHandle array;
  QPDFObjectHandle integer;
  Rectangle r1;
  QPDFObjGen indirect_og;
  QPDFObjectHandle indirect;
  QPDFObjectHandle dictionary;
  QPDFObjectHandle matrix;
  QPDFObjectHandle qtest;
  QPDFObjectHandle null;
  QPDFObjectHandle uninitialized;
  QPDFObjectHandle page;
  QPDFObjectHandle rect;
  undefined1 local_2a8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  _Alloc_hider _Stack_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_280 [2];
  iterator local_258;
  double *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  double local_1f8;
  double local_1f0;
  undefined8 local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  long *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  long local_1c8;
  long lStack_1c0;
  QPDFObjectHandle local_1b8;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  element_type *peStack_190;
  QPDFObjGen local_180;
  BaseHandle local_178;
  string local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  string local_158;
  undefined1 local_138 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined8 local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  undefined8 local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  char local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long *local_50;
  long local_40 [2];
  
  QPDF::getTrailer();
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/QTest","");
  QPDFObjectHandle::getKey((string *)(local_138 + 0x10));
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Dictionary","");
  QPDFObjectHandle::getKey((string *)&local_208);
  p_Var1 = &local_258.m.
            super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Key2","");
  QPDFObjectHandle::getKey((string *)&local_1e8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Dictionary","");
  QPDFObjectHandle::getKey(local_168);
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Integer","");
  QPDFObjectHandle::getKey((string *)&local_1b8);
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::newNull();
  cVar4 = QPDFObjectHandle::isArray();
  if (cVar4 == '\0') {
    __assert_fail("array.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x584,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::aitems();
  QPDFObjectHandle::QPDFArrayItems::begin();
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_2a8);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar5 != 0) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x589,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  plVar7 = (long *)QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_2a8);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)local_2a8);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_2a8);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar5 != 0) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x58c,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_2a8);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_2a8);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_2a8);
  QPDFObjectHandle::QPDFArrayItems::end();
  cVar4 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                    ((iterator *)local_2a8,(iterator *)&local_258);
  if (cVar4 == '\0') {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x590,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_258);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_2a8);
  QPDFObjectHandle::QPDFArrayItems::end();
  cVar4 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                    ((iterator *)local_2a8,(iterator *)&local_258);
  if (cVar4 == '\0') {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x592,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_258);
  if (*plVar7 != 0) {
    __assert_fail("!i_value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x593,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)local_2a8);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar5 != 0) {
    __assert_fail("i_value.getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x595,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_2a8);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar5 != 0) {
    __assert_fail("i->getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x596,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_2a8);
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  cVar4 = QPDFObjectHandle::isDictionary();
  if (cVar4 == '\0') {
    __assert_fail("dictionary.isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x598,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::ditems();
  QPDFObjectHandle::QPDFDictItems::begin();
  pcVar8 = (char *)QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  iVar5 = std::__cxx11::string::compare(pcVar8);
  if (iVar5 != 0) {
    __assert_fail("i->first == \"/Key1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59d,"void test_42(QPDF &, const char *)");
  }
  lVar9 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
  QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar5 != 0) {
    __assert_fail("i->second.getName() == \"/Value1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59f,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)local_2a8);
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)local_2a8);
  QPDFObjectHandle::QPDFDictItems::end();
  cVar4 = QPDFObjectHandle::QPDFDictItems::iterator::operator==((iterator *)local_2a8,&local_258);
  if (cVar4 == '\0') {
    __assert_fail("i == di.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&local_258);
  if (*(long *)(lVar9 + 0x20) != 0) {
    __assert_fail("!i_value.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a3,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)local_2a8);
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare(local_2a8);
  if (iVar5 != 0) {
    __assert_fail("\"\" == qtest.getStringValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a5,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  iVar5 = (int)local_2a8;
  QPDFObjectHandle::getArrayItem(iVar5);
  QPDFObjectHandle::assertNull();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  QPDFObjectHandle::getArrayItem(iVar5);
  QPDFObjectHandle::assertNull();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  QPDFObjectHandle::getArrayItem(iVar5);
  QPDFObjectHandle::assertNull();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  QPDFObjectHandle::appendItem(&local_1b8);
  QPDFObjectHandle::eraseItem((int)&local_1e8);
  QPDFObjectHandle::eraseItem((int)&local_1e8);
  operator____qpdf(local_2a8,0x149a51);
  QPDFObjectHandle::insertItem((int)&local_1e8,(QPDFObjectHandle *)0x2a);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  operator____qpdf(local_2a8,0x149a51);
  QPDFObjectHandle::setArrayItem((int)&local_1e8,(QPDFObjectHandle *)0x2a);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  QPDFObjectHandle::eraseItem((int)&local_1b8);
  QPDFObjectHandle::insertItem((int)&local_1b8,(QPDFObjectHandle *)0x0);
  local_2a8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_298._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QPDFObjectHandle::setArrayFromVector((vector *)&local_1b8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2a8);
  QPDFObjectHandle::setArrayItem((int)&local_1b8,(QPDFObjectHandle *)0x0);
  iVar6 = QPDFObjectHandle::getArrayNItems();
  if (iVar6 != 0) {
    __assert_fail("0 == integer.getArrayNItems()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getArrayAsVector();
  if (local_2a8._0_8_ != local_2a8._8_8_) {
    __assert_fail("integer.getArrayAsVector().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b3,"void test_42(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2a8);
  cVar4 = QPDFObjectHandle::getBoolValue();
  if (cVar4 != '\0') {
    __assert_fail("false == integer.getBoolValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b4,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getDictAsMap_abi_cxx11_();
  if (aaStack_280[0]._M_allocated_capacity != 0) {
    __assert_fail("integer.getDictAsMap().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b5,"void test_42(QPDF &, const char *)");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               *)local_2a8);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  if (aaStack_280[0]._M_allocated_capacity != 0) {
    __assert_fail("integer.getKeys().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b6,"void test_42(QPDF &, const char *)");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a8);
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Potato","");
  cVar4 = QPDFObjectHandle::hasKey((string *)&local_1b8);
  if (cVar4 != '\0') {
    __assert_fail("false == integer.hasKey(\"/Potato\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b7,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Potato","");
  QPDFObjectHandle::removeKey((string *)&local_1b8);
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Potato","");
  QPDFObjectHandle::replaceKey((string *)&local_1b8,(QPDFObjectHandle *)local_2a8);
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Potato","");
  QPDFObjectHandle::newInteger((longlong)&local_258);
  QPDFObjectHandle::replaceKey((string *)&local_1b8,(QPDFObjectHandle *)local_2a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Integer","");
  QPDFObjectHandle::getKeyIfDict((string *)&local_1a8);
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Potato","");
  QPDFObjectHandle::getKeyIfDict((string *)&local_208);
  QPDFObjectHandle::assertNull();
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Integer","");
  QPDFObjectHandle::getKey((string *)&local_208);
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Potato","");
  QPDFObjectHandle::getKeyIfDict(local_60);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Integer","");
  QPDFObjectHandle::getKey((string *)&local_208);
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Potato","");
  QPDFObjectHandle::getKey(local_70);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getInlineImageValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5be,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  lVar9 = QPDFObjectHandle::getIntValue();
  if (lVar9 != 0) {
    __assert_fail("0 == dictionary.getIntValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5bf,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar6 = std::__cxx11::string::compare(local_2a8);
  if (iVar6 != 0) {
    __assert_fail("\"/QPDFFakeName\" == integer.getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c0,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getOperatorValue_abi_cxx11_();
  iVar6 = std::__cxx11::string::compare(local_2a8);
  if (iVar6 != 0) {
    __assert_fail("\"QPDFFAKE\" == integer.getOperatorValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c1,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getRealValue_abi_cxx11_();
  iVar6 = std::__cxx11::string::compare(local_2a8);
  if (iVar6 != 0) {
    __assert_fail("\"0.0\" == dictionary.getRealValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c2,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c3,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getUTF8Value().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c4,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  dVar14 = (double)QPDFObjectHandle::getNumericValue();
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    __assert_fail("0.0 == dictionary.getNumericValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c5,"void test_42(QPDF &, const char *)");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"One error\n",10);
  QPDFObjectHandle::getArrayItem((int)&local_258);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("array.getArrayItem(0).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c8,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"One error\n",10);
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Quack","");
  QPDFObjectHandle::getKey((string *)&local_208);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("dictionary.getKey(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ca,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Quack","");
  QPDFObjectHandle::getKeyIfDict((string *)&local_208);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("dictionary.getKeyIfDict(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cb,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getArrayItem(iVar5);
  cVar4 = QPDFObjectHandle::isDictionary();
  if (cVar4 == '\0') {
    __assert_fail("array.getArrayItem(1).isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cc,"void test_42(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  QPDFObjectHandle::getArrayItem((int)&local_208);
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/K","");
  QPDFObjectHandle::getKey((string *)&local_258);
  cVar4 = QPDFObjectHandle::isArray();
  if (cVar4 == '\0') {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cd,"void test_42(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  QPDFObjectHandle::getArrayItem((int)&local_1a8);
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/K","");
  QPDFObjectHandle::getKey((string *)&local_208);
  QPDFObjectHandle::getArrayItem((int)&local_258);
  cVar4 = QPDFObjectHandle::isName();
  if (cVar4 == '\0') {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).isName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ce,"void test_42(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  QPDFObjectHandle::getArrayItem((int)&local_1d8);
  local_258._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/K","");
  QPDFObjectHandle::getKey((string *)&local_1a8);
  QPDFObjectHandle::getArrayItem((int)&local_208);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare(local_2a8);
  if (iVar5 != 0) {
    __assert_fail("\"/V\" == array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cf,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
    operator_delete(local_258._vptr_iterator,
                    (ulong)((long)&(local_258.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Two errors\n",0xb);
  QPDFObjectHandle::getArrayItem((int)&local_258);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("array.getArrayItem(16059).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d1,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"One error\n",10);
  QPDFObjectHandle::getArrayItem((int)&local_1a8);
  local_2a8._0_8_ = (element_type *)&local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/K","");
  QPDFObjectHandle::getKey((string *)&local_208);
  QPDFObjectHandle::getArrayItem((int)&local_258);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  plVar7 = (long *)QPDF::getAllPages();
  puVar3 = (undefined8 *)*plVar7;
  if ((undefined8 *)plVar7[1] == puVar3) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_e0 = *puVar3;
    local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_d8->_M_use_count = local_d8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_d8->_M_use_count = local_d8->_M_use_count + 1;
      }
    }
    local_258._vptr_iterator = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/Contents","");
    QPDFObjectHandle::getKey((string *)&local_158);
    QPDFObjectHandle::getDict();
    local_208 = &local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"/Potato","");
    QPDFObjectHandle::getKey((string *)&local_1a8);
    QPDFObjectHandle::getName_abi_cxx11_();
    iVar5 = std::__cxx11::string::compare(local_2a8);
    if (iVar5 == 0) {
      if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
        operator_delete((void *)local_2a8._0_8_,
                        (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,(long)local_1f8 + 1);
      }
      if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_258._vptr_iterator != p_Var1) {
        operator_delete(local_258._vptr_iterator,
                        (ulong)((long)&(local_258.m.
                                        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      QPDFObjectHandle::getArrayAsRectangle();
      if ((((((double)local_208 != 0.0) || (NAN((double)local_208))) || ((double)local_200 != 0.0))
          || ((NAN((double)local_200) || (local_1f8 != 0.0)))) ||
         ((NAN(local_1f8) || ((local_1f0 != 0.0 || (NAN(local_1f0))))))) {
        __assert_fail("(r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5d9,"void test_42(QPDF &, const char *)");
      }
      local_2a8._0_8_ = (element_type *)0x3ff3333333333333;
      local_2a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400b333333333333;
      local_298._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4016666666666666;
      _Stack_290._M_p = (pointer)0x401f333333333333;
      QPDFObjectHandle::newFromRectangle((Rectangle *)local_a0);
      QPDFObjectHandle::getArrayAsRectangle();
      if (((((double)local_1a8 <= 1.19) || (1.21 <= (double)local_1a8)) ||
          ((double)p_Stack_1a0 <= 3.39)) ||
         (((3.41 <= (double)p_Stack_1a0 || ((double)local_198 <= 5.59)) ||
          ((5.61 <= (double)local_198 ||
           (((double)peStack_190 <= 7.79 || (7.81 <= (double)peStack_190)))))))) {
        __assert_fail("(r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) && (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5df,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x149f46);
      cVar4 = QPDFObjectHandle::isRectangle();
      if (cVar4 != '\0') {
        __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isRectangle()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e0,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_258,0x149f46);
      QPDFObjectHandle::getArrayAsRectangle();
      local_198 = local_298._M_pi;
      peStack_190 = (element_type *)_Stack_290._M_p;
      local_1a8 = (element_type *)local_2a8._0_8_;
      p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_258.m.
          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_258.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      if (((((double)local_208 != 0.0) || (NAN((double)local_208))) || ((double)local_200 != 0.0))
         || (((NAN((double)local_200) || (local_1f8 != 0.0)) ||
             ((NAN(local_1f8) || ((local_1f0 != 0.0 || (NAN(local_1f0))))))))) {
        __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e2,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x149fad);
      cVar4 = QPDFObjectHandle::isRectangle();
      if (cVar4 != '\0') {
        __assert_fail("!\"[1 2 3]\"_qpdf.isRectangle()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e3,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_258,0x149fad);
      QPDFObjectHandle::getArrayAsRectangle();
      local_198 = local_298._M_pi;
      peStack_190 = (element_type *)_Stack_290._M_p;
      local_1a8 = (element_type *)local_2a8._0_8_;
      p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_258.m.
          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_258.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      if (((((((double)local_208 != 0.0) || (NAN((double)local_208))) || ((double)local_200 != 0.0))
           || ((NAN((double)local_200) || (local_1f8 != 0.0)))) || (NAN(local_1f8))) ||
         ((local_1f0 != 0.0 || (NAN(local_1f0))))) {
        __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e5,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x149fd3);
      cVar4 = QPDFObjectHandle::isRectangle();
      if (cVar4 != '\0') {
        __assert_fail("!\"[1 2 false 4]\"_qpdf.isRectangle()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e6,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_258,0x149fd3);
      QPDFObjectHandle::getArrayAsRectangle();
      local_198 = local_298._M_pi;
      peStack_190 = (element_type *)_Stack_290._M_p;
      local_1a8 = (element_type *)local_2a8._0_8_;
      p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_258.m.
          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_258.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      if (((((double)local_208 != 0.0) || (NAN((double)local_208))) || ((double)local_200 != 0.0))
         || (((NAN((double)local_200) || (local_1f8 != 0.0)) ||
             ((NAN(local_1f8) || ((local_1f0 != 0.0 || (NAN(local_1f0))))))))) {
        __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e8,"void test_42(QPDF &, const char *)");
      }
      local_2a8._0_8_ = (element_type *)0x3ff3333333333333;
      local_2a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400b333333333333;
      local_298._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4016666666666666;
      _Stack_290._M_p = (pointer)0x401f333333333333;
      local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4022333333333333;
      aaStack_280[0]._M_allocated_capacity = 2.3;
      QPDFObjectHandle::newFromMatrix((Matrix *)local_138);
      QPDFObjectHandle::getArrayAsMatrix();
      if (((((double)local_258._vptr_iterator <= 1.19) || (1.21 <= (double)local_258._vptr_iterator)
           ) || ((double)local_258.m.
                         super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr <= 3.39)) ||
         (((3.41 <= (double)local_258.m.
                            super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr ||
           ((double)local_258.m.
                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi <= 5.59)) ||
          ((((5.61 <= (double)local_258.m.
                              super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi ||
             (((double)local_258.ivalue.first._M_dataplus._M_p <= 7.79 ||
              (7.81 <= (double)local_258.ivalue.first._M_dataplus._M_p)))) ||
            ((double)local_258.ivalue.first._M_string_length <= 9.09)) ||
           (((9.11 <= (double)local_258.ivalue.first._M_string_length ||
             ((double)local_258.ivalue.first.field_2._M_allocated_capacity <= 2.29)) ||
            (2.31 <= (double)local_258.ivalue.first.field_2._M_allocated_capacity)))))))) {
        __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5ef,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isMatrix();
      if (cVar4 == '\0') {
        __assert_fail("matrix.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f0,"void test_42(QPDF &, const char *)");
      }
      QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_2a8,1.2,3.4,5.6,7.8,9.1,2.3);
      QPDFObjectHandle::newFromMatrix((QPDFMatrix *)&local_1d8);
      uVar11 = local_138._8_8_;
      local_138._8_8_ = p_Stack_1d0;
      local_138._0_8_ = local_1d8;
      local_1d8 = (long *)0x0;
      p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
      }
      if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
      }
      QPDFObjectHandle::getArrayAsMatrix();
      local_258.ivalue.first._M_string_length = (size_type)local_288._M_pi;
      local_258.ivalue.first.field_2._M_allocated_capacity = aaStack_280[0]._M_allocated_capacity;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_298._M_pi;
      local_258.ivalue.first._M_dataplus._M_p = _Stack_290._M_p;
      local_258._vptr_iterator = (_func_int **)local_2a8._0_8_;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8._8_8_;
      if (((((double)local_2a8._0_8_ <= 1.19) || (1.21 <= (double)local_2a8._0_8_)) ||
          (((double)local_2a8._8_8_ <= 3.39 ||
           ((3.41 <= (double)local_2a8._8_8_ || ((double)local_298._M_pi <= 5.59)))))) ||
         ((5.61 <= (double)local_298._M_pi ||
          ((((((double)_Stack_290._M_p <= 7.79 || (7.81 <= (double)_Stack_290._M_p)) ||
             ((double)local_288._M_pi <= 9.09)) ||
            ((9.11 <= (double)local_288._M_pi || ((double)aaStack_280[0]._0_8_ <= 2.29)))) ||
           (2.31 <= (double)aaStack_280[0]._0_8_)))))) {
        __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f5,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isMatrix();
      if (cVar4 == '\0') {
        __assert_fail("matrix.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f6,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x149f46);
      cVar4 = QPDFObjectHandle::isMatrix();
      if (cVar4 != '\0') {
        __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f7,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_1d8,0x149f46);
      QPDFObjectHandle::getArrayAsMatrix();
      local_258.ivalue.first._M_string_length = (size_type)local_288._M_pi;
      local_258.ivalue.first.field_2._M_allocated_capacity = aaStack_280[0]._M_allocated_capacity;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_298._M_pi;
      local_258.ivalue.first._M_dataplus._M_p = _Stack_290._M_p;
      local_258._vptr_iterator = (_func_int **)local_2a8._0_8_;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8._8_8_;
      if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
      }
      if (((((double)local_258._vptr_iterator != 0.0) || (NAN((double)local_258._vptr_iterator))) ||
          (((double)local_258.m.
                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != 0.0 ||
           (((NAN((double)local_258.m.
                          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr) ||
             ((double)local_258.m.
                      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != 0.0)) ||
            (NAN((double)local_258.m.
                         super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi))))))) ||
         ((((((double)local_258.ivalue.first._M_dataplus._M_p != 0.0 ||
             (NAN((double)local_258.ivalue.first._M_dataplus._M_p))) ||
            ((double)local_258.ivalue.first._M_string_length != 0.0)) ||
           ((NAN((double)local_258.ivalue.first._M_string_length) ||
            ((double)local_258.ivalue.first.field_2._M_allocated_capacity != 0.0)))) ||
          (NAN((double)local_258.ivalue.first.field_2._M_allocated_capacity))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f9,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x14a132);
      cVar4 = QPDFObjectHandle::isMatrix();
      if (cVar4 != '\0') {
        __assert_fail("!\"[1 2 3 4 5 6 7]\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5fa,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_1d8,0x14a132);
      QPDFObjectHandle::getArrayAsMatrix();
      local_258.ivalue.first._M_string_length = (size_type)local_288._M_pi;
      local_258.ivalue.first.field_2._M_allocated_capacity = aaStack_280[0]._M_allocated_capacity;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_298._M_pi;
      local_258.ivalue.first._M_dataplus._M_p = _Stack_290._M_p;
      local_258._vptr_iterator = (_func_int **)local_2a8._0_8_;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8._8_8_;
      if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
      }
      if (((((((double)local_258._vptr_iterator != 0.0) || (NAN((double)local_258._vptr_iterator)))
            || ((double)local_258.m.
                        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr != 0.0)) ||
           ((NAN((double)local_258.m.
                         super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr) ||
            ((double)local_258.m.
                     super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi != 0.0)))) ||
          ((NAN((double)local_258.m.
                        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) ||
           (((double)local_258.ivalue.first._M_dataplus._M_p != 0.0 ||
            (NAN((double)local_258.ivalue.first._M_dataplus._M_p))))))) ||
         (((double)local_258.ivalue.first._M_string_length != 0.0 ||
          (((NAN((double)local_258.ivalue.first._M_string_length) ||
            ((double)local_258.ivalue.first.field_2._M_allocated_capacity != 0.0)) ||
           (NAN((double)local_258.ivalue.first.field_2._M_allocated_capacity))))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5fc,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x14a165);
      cVar4 = QPDFObjectHandle::isMatrix();
      if (cVar4 != '\0') {
        __assert_fail("!\"[1 2 3 false 5 6 7]\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5fd,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_1d8,0x14a165);
      QPDFObjectHandle::getArrayAsMatrix();
      local_258.ivalue.first._M_string_length = (size_type)local_288._M_pi;
      local_258.ivalue.first.field_2._M_allocated_capacity = aaStack_280[0]._M_allocated_capacity;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_298._M_pi;
      local_258.ivalue.first._M_dataplus._M_p = _Stack_290._M_p;
      local_258._vptr_iterator = (_func_int **)local_2a8._0_8_;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8._8_8_;
      if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
      }
      if (((((double)local_258._vptr_iterator != 0.0) || (NAN((double)local_258._vptr_iterator))) ||
          (((double)local_258.m.
                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != 0.0 ||
           ((NAN((double)local_258.m.
                         super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr) ||
            ((double)local_258.m.
                     super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi != 0.0)))))) ||
         (((NAN((double)local_258.m.
                        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) ||
           (((((double)local_258.ivalue.first._M_dataplus._M_p != 0.0 ||
              (NAN((double)local_258.ivalue.first._M_dataplus._M_p))) ||
             ((double)local_258.ivalue.first._M_string_length != 0.0)) ||
            ((NAN((double)local_258.ivalue.first._M_string_length) ||
             ((double)local_258.ivalue.first.field_2._M_allocated_capacity != 0.0)))))) ||
          (NAN((double)local_258.ivalue.first.field_2._M_allocated_capacity))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5ff,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_2a8,0x14a2fc);
      cVar4 = QPDFObjectHandle::isMatrix();
      if (cVar4 != '\0') {
        __assert_fail("!\"42\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x600,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      operator____qpdf((char *)&local_1d8,0x14a2fc);
      QPDFObjectHandle::getArrayAsMatrix();
      local_258.ivalue.first._M_string_length = (size_type)local_288._M_pi;
      local_258.ivalue.first.field_2._M_allocated_capacity = aaStack_280[0]._M_allocated_capacity;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_298._M_pi;
      local_258.ivalue.first._M_dataplus._M_p = _Stack_290._M_p;
      local_258._vptr_iterator = (_func_int **)local_2a8._0_8_;
      local_258.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_2a8._8_8_;
      if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
      }
      if ((((double)local_258._vptr_iterator != 0.0) || (NAN((double)local_258._vptr_iterator))) ||
         ((((((double)local_258.m.
                      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != 0.0 ||
             (((NAN((double)local_258.m.
                            super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr) ||
               ((double)local_258.m.
                        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != 0.0)) ||
              (NAN((double)local_258.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi))))) ||
            ((((double)local_258.ivalue.first._M_dataplus._M_p != 0.0 ||
              (NAN((double)local_258.ivalue.first._M_dataplus._M_p))) ||
             ((double)local_258.ivalue.first._M_string_length != 0.0)))) ||
           ((NAN((double)local_258.ivalue.first._M_string_length) ||
            ((double)local_258.ivalue.first.field_2._M_allocated_capacity != 0.0)))) ||
          (NAN((double)local_258.ivalue.first.field_2._M_allocated_capacity))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x602,"void test_42(QPDF &, const char *)");
      }
      local_108 = 0;
      p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cVar4 = QPDFObjectHandle::isInteger();
      if (cVar4 != '\0') {
        __assert_fail("!uninitialized.isInteger()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x607,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isDictionary();
      if (cVar4 != '\0') {
        __assert_fail("!uninitialized.isDictionary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x608,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isScalar();
      if (cVar4 != '\0') {
        __assert_fail("!uninitialized.isScalar()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x609,"void test_42(QPDF &, const char *)");
      }
      QPDF::newIndirectNull();
      local_180 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
      QVar10 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_178);
      local_f0 = local_1e8;
      local_e8 = local_1e0;
      if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1e0->_M_use_count = local_1e0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1e0->_M_use_count = local_1e0->_M_use_count + 1;
        }
      }
      QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_f0;
      QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)QVar10;
      QPDF::replaceObject((QPDFObjGen)pdf,QVar15);
      if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
      }
      cVar4 = QPDFObjectHandle::isIndirect();
      if (cVar4 == '\0') {
        __assert_fail("array.isIndirect()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x60f,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isArray();
      if (cVar4 == '\0') {
        __assert_fail("indirect.isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x610,"void test_42(QPDF &, const char *)");
      }
      uVar11 = QPDFObjectHandle::getObjGen();
      if ((local_180.obj != (int)uVar11) || (local_180.gen != (int)((ulong)uVar11 >> 0x20))) {
        __assert_fail("array.getObjGen() == indirect_og",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x611,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isArray();
      if (cVar4 == '\0') {
        __assert_fail("array.isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x612,"void test_42(QPDF &, const char *)");
      }
      cVar4 = QPDFObjectHandle::isArray();
      if (cVar4 == '\0') {
        __assert_fail("indirect.isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x613,"void test_42(QPDF &, const char *)");
      }
      QPDFObjectHandle::unparse_abi_cxx11_();
      QPDFObjGen::unparse_abi_cxx11_(&local_158,&local_180,' ');
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_1c8 = *plVar12;
        lStack_1c0 = plVar7[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar12;
        local_1d8 = (long *)*plVar7;
      }
      p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ != p_Stack_1d0) {
LAB_001247dc:
        __assert_fail("indirect.unparse() == indirect_og.unparse(\' \') + \" R\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x614,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = bcmp((void *)local_2a8._0_8_,local_1d8,local_2a8._8_8_);
        if (iVar5 != 0) goto LAB_001247dc;
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      paVar2 = &local_158.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_2a8._0_8_ != (element_type *)&local_298) {
        operator_delete((void *)local_2a8._0_8_,
                        (ulong)((long)&(local_298._M_pi)->_vptr__Sp_counted_base + 1));
      }
      Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_2a8,"",(Pipeline *)0x0);
      QPDFObjectHandle::writeJSON((int)&local_1e8,(Pipeline *)0x2,SUB81(local_2a8,0),1);
      Pl_Buffer::finish();
      Pl_Buffer::getString_abi_cxx11_();
      QPDFObjGen::unparse_abi_cxx11_((string *)(local_a0 + 0x10),&local_180,' ');
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)(local_a0 + 0x10),0,(char *)0x0,0x14ab9a);
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_b0 = *plVar12;
        lStack_a8 = plVar7[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar12;
        local_c0 = (long *)*plVar7;
      }
      local_b8 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
      psVar13 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_158.field_2._M_allocated_capacity = *psVar13;
        local_158.field_2._8_8_ = plVar7[3];
        local_158._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar13;
        local_158._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_158._M_string_length = plVar7[1];
      *plVar7 = (long)psVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (p_Stack_1d0 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length)
      {
        if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar5 = bcmp(local_1d8,local_158._M_dataplus._M_p,(size_t)p_Stack_1d0);
          if (iVar5 != 0) goto LAB_001247fb;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._16_8_ != &local_80) {
          operator_delete((void *)local_a0._16_8_,local_80._M_allocated_capacity + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        operator____qpdf((char *)&local_1d8,0x14a2fc);
        QPDFObjectHandle::setArrayItem((int)&local_1e8,(QPDFObjectHandle *)0x1);
        if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
        }
        QPDFObjectHandle::getArrayItem((int)&local_1d8);
        lVar9 = QPDFObjectHandle::getIntValue();
        if (lVar9 != 0x2a) {
          __assert_fail("indirect.getArrayItem(1).getIntValue() == 42",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                        ,0x61c,"void test_42(QPDF &, const char *)");
        }
        if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
        }
        QVar10 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_178);
        operator____qpdf(local_d0,0x14a2fc);
        QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0;
        QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)QVar10;
        QPDF::replaceObject((QPDFObjGen)pdf,QVar16);
        if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
        }
        cVar4 = QPDFObjectHandle::isInteger();
        if (cVar4 != '\0') {
          Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_2a8);
          if (local_178.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_178.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
          }
          if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
          }
          if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
          }
          if (local_1b8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
          }
          if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
          }
          if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
          }
          return;
        }
        __assert_fail("array.isInteger()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x61f,"void test_42(QPDF &, const char *)");
      }
LAB_001247fb:
      __assert_fail("pl1.getString() == std::string(\"\\\"\" + indirect_og.unparse(\' \') + \" R\\\"\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x619,"void test_42(QPDF &, const char *)");
    }
  }
  __assert_fail("\"/QPDFFakeName\" == page.getKey(\"/Contents\").getDict().getKey(\"/Potato\").getName()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x5d6,"void test_42(QPDF &, const char *)");
}

Assistant:

static void
test_42(QPDF& pdf, char const* arg2)
{
    // Access objects as wrong type. This test case is crafted to work with object-types.pdf.
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFObjectHandle array = qtest.getKey("/Dictionary").getKey("/Key2");
    QPDFObjectHandle dictionary = qtest.getKey("/Dictionary");
    QPDFObjectHandle integer = qtest.getKey("/Integer");
    QPDFObjectHandle null = QPDFObjectHandle::newNull();
    assert(array.isArray());
    {
        // Exercise iterators directly
        auto ai = array.aitems();
        auto i = ai.begin();
        assert(i->getName() == "/Item0");
        auto& i_value = *i;
        --i;
        assert(i->getName() == "/Item0");
        ++i;
        ++i;
        ++i;
        assert(i == ai.end());
        ++i;
        assert(i == ai.end());
        assert(!i_value);
        --i;
        assert(i_value.getName() == "/Item2");
        assert(i->getName() == "/Item2");
    }
    assert(dictionary.isDictionary());
    {
        // Exercise iterators directly
        auto di = dictionary.ditems();
        auto i = di.begin();
        assert(i->first == "/Key1");
        auto& i_value = *i;
        assert(i->second.getName() == "/Value1");
        ++i;
        ++i;
        assert(i == di.end());
        assert(!i_value.second);
    }
    assert("" == qtest.getStringValue());
    array.getArrayItem(-1).assertNull();
    array.getArrayItem(16059).assertNull();
    integer.getArrayItem(0).assertNull();
    integer.appendItem(null);
    array.eraseItem(-1);
    array.eraseItem(16059);
    array.insertItem(42, "/Dontpanic"_qpdf);
    array.setArrayItem(42, "/Dontpanic"_qpdf);
    integer.eraseItem(0);
    integer.insertItem(0, null);
    integer.setArrayFromVector(std::vector<QPDFObjectHandle>());
    integer.setArrayItem(0, null);
    assert(0 == integer.getArrayNItems());
    assert(integer.getArrayAsVector().empty());
    assert(false == integer.getBoolValue());
    assert(integer.getDictAsMap().empty());
    assert(integer.getKeys().empty());
    assert(false == integer.hasKey("/Potato"));
    integer.removeKey("/Potato");
    integer.replaceKey("/Potato", null);
    integer.replaceKey("/Potato", QPDFObjectHandle::newInteger(1));
    null.getKeyIfDict("/Integer").getKeyIfDict("/Potato").assertNull();
    qtest.getKey("/Integer").getKeyIfDict("/Potato");
    qtest.getKey("/Integer").getKey("/Potato");
    assert(integer.getInlineImageValue().empty());
    assert(0 == dictionary.getIntValue());
    assert("/QPDFFakeName" == integer.getName());
    assert("QPDFFAKE" == integer.getOperatorValue());
    assert("0.0" == dictionary.getRealValue());
    assert(integer.getStringValue().empty());
    assert(integer.getUTF8Value().empty());
    assert(0.0 == dictionary.getNumericValue());
    // Make sure error messages are okay for nested values
    std::cerr << "One error\n";
    assert(array.getArrayItem(0).getStringValue().empty());
    std::cerr << "One error\n";
    assert(dictionary.getKey("/Quack").getStringValue().empty());
    assert(dictionary.getKeyIfDict("/Quack").getStringValue().empty());
    assert(array.getArrayItem(1).isDictionary());
    assert(array.getArrayItem(1).getKey("/K").isArray());
    assert(array.getArrayItem(1).getKey("/K").getArrayItem(0).isName());
    assert("/V" == array.getArrayItem(1).getKey("/K").getArrayItem(0).getName());
    std::cerr << "Two errors\n";
    assert(array.getArrayItem(16059).getStringValue().empty());
    std::cerr << "One error\n";
    array.getArrayItem(1).getKey("/K").getArrayItem(0).getStringValue();
    // Stream dictionary
    QPDFObjectHandle page = pdf.getAllPages().at(0);
    assert("/QPDFFakeName" == page.getKey("/Contents").getDict().getKey("/Potato").getName());
    // Rectangle
    QPDFObjectHandle::Rectangle r0 = integer.getArrayAsRectangle();
    assert((r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0));
    QPDFObjectHandle rect =
        QPDFObjectHandle::newFromRectangle(QPDFObjectHandle::Rectangle(1.2, 3.4, 5.6, 7.8));
    QPDFObjectHandle::Rectangle r1 = rect.getArrayAsRectangle();
    assert(
        (r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) &&
        (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81));
    assert(!"[1 2 3 4 5]"_qpdf.isRectangle());
    r1 = "[1 2 3 4 5]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 3]"_qpdf.isRectangle());
    r1 = "[1 2 3]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 false 4]"_qpdf.isRectangle());
    r1 = "[1 2 false 4]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    // Matrix
    auto matrix =
        QPDFObjectHandle::newFromMatrix(QPDFObjectHandle::Matrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    auto m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    matrix = QPDFObjectHandle::newFromMatrix(QPDFMatrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    assert(!"[1 2 3 4 5]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 4 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 false 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 false 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"42"_qpdf.isMatrix());
    m1 = "42"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);

    // Uninitialized
    QPDFObjectHandle uninitialized;
    assert(!uninitialized);
    assert(!uninitialized.isInteger());
    assert(!uninitialized.isDictionary());
    assert(!uninitialized.isScalar());

    // Reference
    auto indirect = pdf.newIndirectNull();
    QPDFObjGen indirect_og{indirect.getObjGen()};
    pdf.replaceObject(indirect, array);
    assert(array.isIndirect());
    assert(indirect.isArray());
    assert(array.getObjGen() == indirect_og);
    assert(array.isArray());
    assert(indirect.isArray());
    assert(indirect.unparse() == indirect_og.unparse(' ') + " R");

    auto pl1 = Pl_Buffer("");
    array.writeJSON(2, &pl1, true);
    pl1.finish();
    assert(pl1.getString() == std::string("\"" + indirect_og.unparse(' ') + " R\""));

    array.setArrayItem(1, "42"_qpdf);
    assert(indirect.getArrayItem(1).getIntValue() == 42);

    pdf.replaceObject(indirect, "42"_qpdf);
    assert(array.isInteger());
}